

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeFinishMoveto(VdbeCursor *p)

{
  int iVar1;
  undefined8 in_RAX;
  int res;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  iVar1 = sqlite3BtreeTableMoveto((p->uc).pCursor,p->movetoTarget,0,&local_14);
  if (iVar1 == 0) {
    if (local_14 == 0) {
      p->deferredMoveto = '\0';
      p->cacheStatus = 0;
      iVar1 = 0;
    }
    else {
      iVar1 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x14e42,
                  "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
    }
  }
  return iVar1;
}

Assistant:

SQLITE_NOINLINE sqlite3VdbeFinishMoveto(VdbeCursor *p){
  int res, rc;
#ifdef SQLITE_TEST
  extern int sqlite3_search_count;
#endif
  assert( p->deferredMoveto );
  assert( p->isTable );
  assert( p->eCurType==CURTYPE_BTREE );
  rc = sqlite3BtreeTableMoveto(p->uc.pCursor, p->movetoTarget, 0, &res);
  if( rc ) return rc;
  if( res!=0 ) return SQLITE_CORRUPT_BKPT;
#ifdef SQLITE_TEST
  sqlite3_search_count++;
#endif
  p->deferredMoveto = 0;
  p->cacheStatus = CACHE_STALE;
  return SQLITE_OK;
}